

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a2934::cmQtAutoMocUicT::JobT::RunProcess
          (JobT *this,GenT genType,ProcessResultT *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *infoMessage)

{
  string_view str;
  string_view view;
  undefined1 auVar1 [16];
  bool bVar2;
  Logger *pLVar3;
  BaseSettingsT *pBVar4;
  char *str_00;
  bool local_141;
  char local_121;
  string local_120;
  size_t local_100;
  size_t local_f8;
  cmAlphaNum local_f0;
  size_t local_c0;
  size_t local_b8;
  cmAlphaNum local_b0;
  string local_80;
  string_view local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  string_view info;
  string *infoMessage_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  ProcessResultT *result_local;
  GenT genType_local;
  JobT *this_local;
  
  info._M_str = (char *)infoMessage;
  pLVar3 = Log(this);
  bVar2 = cmQtAutoGenerator::Logger::Verbose(pLVar3);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    auVar1._8_8_ = info._M_len;
    auVar1._0_8_ = local_40;
    if (info._M_str != (char *)0x0) {
      local_50 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)info._M_str);
      auVar1 = local_50;
    }
    info._M_len = auVar1._8_8_;
    local_40 = auVar1._0_8_;
    pLVar3 = Log(this);
    local_c0 = (size_t)local_40;
    local_b8 = info._M_len;
    view._M_str = (char *)info._M_len;
    view._M_len = (size_t)local_40;
    cmAlphaNum::cmAlphaNum(&local_b0,view);
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    local_141 = true;
    if (!bVar2) {
      local_100 = (size_t)local_40;
      local_f8 = info._M_len;
      str._M_str = (char *)info._M_len;
      str._M_len = (size_t)local_40;
      local_141 = cmHasSuffix(str,'\n');
    }
    str_00 = "\n";
    if (local_141 != false) {
      str_00 = "";
    }
    cmAlphaNum::cmAlphaNum(&local_f0,str_00);
    cmQtAutoGen::QuotedCommand(&local_120,command);
    local_121 = '\n';
    cmStrCat<std::__cxx11::string,char>(&local_80,&local_b0,&local_f0,&local_120,&local_121);
    local_60 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_80);
    cmQtAutoGenerator::Logger::Info(pLVar3,genType,local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_120);
  }
  pBVar4 = BaseConst(this);
  bVar2 = cmWorkerPool::JobT::RunProcess(&this->super_JobT,result,command,&pBVar4->AutogenBuildDir);
  return bVar2;
}

Assistant:

bool cmQtAutoMocUicT::JobT::RunProcess(GenT genType,
                                       cmWorkerPool::ProcessResultT& result,
                                       std::vector<std::string> const& command,
                                       std::string* infoMessage)
{
  // Log command
  if (this->Log().Verbose()) {
    cm::string_view info;
    if (infoMessage != nullptr) {
      info = *infoMessage;
    }
    this->Log().Info(
      genType,
      cmStrCat(info, info.empty() || cmHasSuffix(info, '\n') ? "" : "\n",
               QuotedCommand(command), '\n'));
  }
  // Run command
  return this->cmWorkerPool::JobT::RunProcess(
    result, command, this->BaseConst().AutogenBuildDir);
}